

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::GetEncodedLiteral
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *lit)

{
  int iVar1;
  undefined4 extraout_var;
  string local_40 [8];
  string result;
  string *lit_local;
  cmGlobalNinjaGenerator *this_local;
  
  result.field_2._8_8_ = lit;
  std::__cxx11::string::string(local_40,(string *)lit);
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x3c])(this,local_40);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var,iVar1));
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::GetEncodedLiteral(const std::string& lit)
{
  std::string result = lit;
  return this->EncodeLiteral(result);
}